

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::
     map_slot_policy<std::__cxx11::string,std::function<bool(std::__cxx11::string_const&)>>::
     construct<std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<covscript_main(int,char**)::__4&&>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *args_1,tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_debugger_cpp:546:34)_&&>
                       *args_2)

{
  piecewise_construct_t *in_RCX;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *in_RSI;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_R8;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::emplace((slot_type *)0x12a076);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>>
  ::
  construct<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<covscript_main(int,char**)::__4&&>>
            (in_RSI,in_RDX,in_RCX,in_R8,
             (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_covscript[P]covscript_sources_debugger_cpp:546:34)_&&>
              *)0x12a093);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}